

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerlinNoise.cpp
# Opt level: O0

double __thiscall PerlinNoise::grad(PerlinNoise *this,int hash,double x,double y,double z)

{
  uint uVar1;
  double local_78;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double v;
  double u;
  int h;
  double z_local;
  double y_local;
  double x_local;
  int hash_local;
  PerlinNoise *this_local;
  
  uVar1 = hash & 0xf;
  local_50 = y;
  if (uVar1 < 8) {
    local_50 = x;
  }
  local_58 = y;
  if (3 < uVar1) {
    local_60 = x;
    if ((uVar1 != 0xc) && (uVar1 != 0xe)) {
      local_60 = z;
    }
    local_58 = local_60;
  }
  if ((hash & 1U) == 0) {
    local_68 = local_50;
  }
  else {
    local_68 = -local_50;
  }
  if ((hash & 2U) == 0) {
    local_78 = local_58;
  }
  else {
    local_78 = -local_58;
  }
  return local_68 + local_78;
}

Assistant:

double PerlinNoise::grad(int hash, double x, double y, double z) {
    int h = hash & 15;
    // Convert lower 4 bits of hash into 12 gradient directions
    double u = h < 8 ? x : y,
           v = h < 4 ? y : h == 12 || h == 14 ? x : z;
    return ((h & 1) == 0 ? u : -u) + ((h & 2) == 0 ? v : -v);
}